

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  float **ppfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  byte bVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  uint uVar28;
  long lVar29;
  long lVar30;
  byte bVar31;
  ulong uVar32;
  byte bVar33;
  ulong uVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  bool bVar39;
  uint uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  float fVar62;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  undefined1 auVar67 [32];
  undefined4 uVar68;
  float fVar69;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar70 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [64];
  uint uVar82;
  float fVar83;
  float fVar84;
  undefined1 auVar81 [32];
  float fVar85;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  MoellerTrumboreHitM<8,_embree::avx512::UVIdentity<8>_> hit;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  long lStack_2748;
  int local_2714;
  ulong local_2710;
  ulong local_2708;
  RayHit *local_2700;
  RTCIntersectArguments *local_26f8;
  long local_26f0;
  RayQueryContext *local_26e8;
  Geometry *local_26e0;
  Scene *local_26d8;
  ulong *local_26d0;
  long local_26c8;
  RTCFilterFunctionNArguments local_26c0;
  float local_2690;
  undefined4 local_268c;
  undefined4 local_2688;
  undefined4 local_2684;
  undefined4 local_2680;
  undefined4 local_267c;
  uint local_2678;
  uint local_2674;
  uint local_2670;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  byte local_249f;
  float local_2480 [4];
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  undefined4 uStack_2464;
  float local_2460 [4];
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  undefined4 uStack_2444;
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  undefined1 auVar49 [32];
  
  local_23a0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_26d0 = local_2390;
    local_2398[0] = 0;
    aVar1 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar44 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar12 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar41._8_4_ = 0x7fffffff;
    auVar41._0_8_ = 0x7fffffff7fffffff;
    auVar41._12_4_ = 0x7fffffff;
    auVar41 = vandps_avx512vl((undefined1  [16])aVar1,auVar41);
    auVar74._8_4_ = 0x219392ef;
    auVar74._0_8_ = 0x219392ef219392ef;
    auVar74._12_4_ = 0x219392ef;
    uVar34 = vcmpps_avx512vl(auVar41,auVar74,1);
    bVar39 = (bool)((byte)uVar34 & 1);
    auVar42._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * (int)aVar1.x;
    bVar39 = (bool)((byte)(uVar34 >> 1) & 1);
    auVar42._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * (int)aVar1.y;
    bVar39 = (bool)((byte)(uVar34 >> 2) & 1);
    auVar42._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * (int)aVar1.z;
    bVar39 = (bool)((byte)(uVar34 >> 3) & 1);
    auVar42._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * aVar1.field_3.a;
    auVar41 = vrcp14ps_avx512vl(auVar42);
    auVar43._8_4_ = 0x3f800000;
    auVar43._0_8_ = 0x3f8000003f800000;
    auVar43._12_4_ = 0x3f800000;
    auVar43 = vfnmadd213ps_avx512vl(auVar42,auVar41,auVar43);
    auVar42 = vfmadd132ps_fma(auVar43,auVar41,auVar41);
    auVar45 = vbroadcastss_avx512vl(auVar42);
    auVar88 = ZEXT3264(auVar45);
    auVar41 = vmovshdup_avx(auVar42);
    auVar45 = vbroadcastsd_avx512vl(auVar41);
    auVar89 = ZEXT3264(auVar45);
    auVar43 = vshufpd_avx(auVar42,auVar42,1);
    auVar49._8_4_ = 2;
    auVar49._0_8_ = 0x200000002;
    auVar49._12_4_ = 2;
    auVar49._16_4_ = 2;
    auVar49._20_4_ = 2;
    auVar49._24_4_ = 2;
    auVar49._28_4_ = 2;
    auVar45 = vpermps_avx512vl(auVar49,ZEXT1632(auVar42));
    auVar90 = ZEXT3264(auVar45);
    fVar62 = auVar42._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar51._4_4_ = fVar62;
    auVar51._0_4_ = fVar62;
    auVar51._8_4_ = fVar62;
    auVar51._12_4_ = fVar62;
    auVar51._16_4_ = fVar62;
    auVar51._20_4_ = fVar62;
    auVar51._24_4_ = fVar62;
    auVar51._28_4_ = fVar62;
    auVar45 = vbroadcastss_avx512vl(ZEXT416(1));
    auVar91 = ZEXT3264(auVar45);
    auVar47 = ZEXT1632(CONCAT412(auVar42._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar42._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar42._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar62))
                                ));
    auVar46 = vpermps_avx512vl(auVar45,auVar47);
    auVar45 = vpermps_avx2(auVar49,auVar47);
    local_2708 = (ulong)(auVar42._0_4_ < 0.0) << 5;
    local_2710 = (ulong)(auVar41._0_4_ < 0.0) << 5 | 0x40;
    uVar34 = (ulong)(auVar43._0_4_ < 0.0) << 5 | 0x80;
    uVar36 = local_2708 ^ 0x20;
    uVar38 = local_2710 ^ 0x20;
    uVar68 = auVar12._0_4_;
    auVar66 = ZEXT3264(CONCAT428(uVar68,CONCAT424(uVar68,CONCAT420(uVar68,CONCAT416(uVar68,CONCAT412
                                                  (uVar68,CONCAT48(uVar68,CONCAT44(uVar68,uVar68))))
                                                  ))));
    auVar48._8_4_ = 0x80000000;
    auVar48._0_8_ = 0x8000000080000000;
    auVar48._12_4_ = 0x80000000;
    auVar48._16_4_ = 0x80000000;
    auVar48._20_4_ = 0x80000000;
    auVar48._24_4_ = 0x80000000;
    auVar48._28_4_ = 0x80000000;
    auVar47 = vxorps_avx512vl(auVar51,auVar48);
    auVar92 = ZEXT3264(auVar47);
    auVar46 = vxorps_avx512vl(auVar46,auVar48);
    auVar93 = ZEXT3264(auVar46);
    auVar45 = vxorps_avx512vl(auVar45,auVar48);
    auVar94 = ZEXT3264(auVar45);
    auVar45 = vbroadcastss_avx512vl(auVar44);
    auVar95 = ZEXT3264(auVar45);
    auVar45 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar96 = ZEXT3264(auVar45);
    auVar45 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar97 = ZEXT3264(auVar45);
    auVar44 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
    auVar98 = ZEXT1664(auVar44);
    auVar45 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
    auVar99 = ZEXT3264(auVar45);
    auVar45 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
    auVar100 = ZEXT3264(auVar45);
    local_26e8 = context;
    local_2700 = ray;
LAB_01c6998e:
    if (local_26d0 != &local_23a0) {
      pfVar3 = (float *)(local_26d0 + -1);
      local_26d0 = local_26d0 + -2;
      if (*pfVar3 <= (local_2700->super_RayK<1>).tfar) {
        uVar37 = *local_26d0;
LAB_01c699b3:
        do {
          if ((uVar37 & 8) != 0) goto LAB_01c69d03;
          auVar45 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar37 + 0x40 + local_2708),auVar92._0_32_,
                               auVar88._0_32_);
          auVar46 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar37 + 0x40 + local_2710),auVar93._0_32_,
                               auVar89._0_32_);
          auVar45 = vpmaxsd_avx2(auVar45,auVar46);
          auVar46 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar37 + 0x40 + uVar34),auVar94._0_32_,
                               auVar90._0_32_);
          auVar46 = vpmaxsd_avx512vl(auVar46,auVar95._0_32_);
          auVar45 = vpmaxsd_avx2(auVar45,auVar46);
          auVar46 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar37 + 0x40 + uVar36),auVar92._0_32_,
                               auVar88._0_32_);
          auVar47 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar37 + 0x40 + uVar38),auVar93._0_32_,
                               auVar89._0_32_);
          auVar46 = vpminsd_avx2(auVar46,auVar47);
          auVar47 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar37 + 0x40 + (uVar34 ^ 0x20)),
                               auVar94._0_32_,auVar90._0_32_);
          auVar47 = vpminsd_avx2(auVar47,auVar66._0_32_);
          auVar46 = vpminsd_avx2(auVar46,auVar47);
          uVar32 = vpcmpd_avx512vl(auVar45,auVar46,2);
          bVar33 = (byte)uVar32;
          if (bVar33 == 0) break;
          auVar46 = *(undefined1 (*) [32])(uVar37 & 0xfffffffffffffff0);
          auVar47 = ((undefined1 (*) [32])(uVar37 & 0xfffffffffffffff0))[1];
          auVar48 = vmovdqa64_avx512vl(auVar96._0_32_);
          auVar48 = vpternlogd_avx512vl(auVar48,auVar45,auVar97._0_32_,0xf8);
          auVar49 = vpcompressd_avx512vl(auVar48);
          auVar50._0_4_ =
               (uint)(bVar33 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar33 & 1) * auVar48._0_4_;
          bVar39 = (bool)((byte)(uVar32 >> 1) & 1);
          auVar50._4_4_ = (uint)bVar39 * auVar49._4_4_ | (uint)!bVar39 * auVar48._4_4_;
          bVar39 = (bool)((byte)(uVar32 >> 2) & 1);
          auVar50._8_4_ = (uint)bVar39 * auVar49._8_4_ | (uint)!bVar39 * auVar48._8_4_;
          bVar39 = (bool)((byte)(uVar32 >> 3) & 1);
          auVar50._12_4_ = (uint)bVar39 * auVar49._12_4_ | (uint)!bVar39 * auVar48._12_4_;
          bVar39 = (bool)((byte)(uVar32 >> 4) & 1);
          auVar50._16_4_ = (uint)bVar39 * auVar49._16_4_ | (uint)!bVar39 * auVar48._16_4_;
          bVar39 = (bool)((byte)(uVar32 >> 5) & 1);
          auVar50._20_4_ = (uint)bVar39 * auVar49._20_4_ | (uint)!bVar39 * auVar48._20_4_;
          bVar39 = (bool)((byte)(uVar32 >> 6) & 1);
          auVar50._24_4_ = (uint)bVar39 * auVar49._24_4_ | (uint)!bVar39 * auVar48._24_4_;
          bVar39 = SUB81(uVar32 >> 7,0);
          auVar50._28_4_ = (uint)bVar39 * auVar49._28_4_ | (uint)!bVar39 * auVar48._28_4_;
          auVar48 = vpermt2q_avx512vl(auVar46,auVar50,auVar47);
          uVar37 = auVar48._0_8_;
          bVar33 = bVar33 - 1 & bVar33;
          if (bVar33 != 0) {
            auVar48 = vpshufd_avx2(auVar50,0x55);
            vpermt2q_avx512vl(auVar46,auVar48,auVar47);
            auVar49 = vpminsd_avx2(auVar50,auVar48);
            auVar48 = vpmaxsd_avx2(auVar50,auVar48);
            bVar33 = bVar33 - 1 & bVar33;
            if (bVar33 == 0) {
              auVar49 = vpermi2q_avx512vl(auVar49,auVar46,auVar47);
              uVar37 = auVar49._0_8_;
              auVar46 = vpermt2q_avx512vl(auVar46,auVar48,auVar47);
              *local_26d0 = auVar46._0_8_;
              lVar29 = 8;
              lStack_2748 = 0x10;
            }
            else {
              auVar56 = vpshufd_avx2(auVar50,0xaa);
              vpermt2q_avx512vl(auVar46,auVar56,auVar47);
              auVar51 = vpminsd_avx2(auVar49,auVar56);
              auVar49 = vpmaxsd_avx2(auVar49,auVar56);
              auVar56 = vpminsd_avx2(auVar48,auVar49);
              auVar49 = vpmaxsd_avx2(auVar48,auVar49);
              bVar33 = bVar33 - 1 & bVar33;
              if (bVar33 == 0) {
                auVar48 = vpermi2q_avx512vl(auVar51,auVar46,auVar47);
                uVar37 = auVar48._0_8_;
                auVar48 = vpermt2q_avx512vl(auVar46,auVar49,auVar47);
                *local_26d0 = auVar48._0_8_;
                auVar48 = vpermd_avx2(auVar49,auVar45);
                *(int *)(local_26d0 + 1) = auVar48._0_4_;
                auVar46 = vpermt2q_avx512vl(auVar46,auVar56,auVar47);
                local_26d0[2] = auVar46._0_8_;
                lStack_2748 = 0x18;
                lVar29 = lStack_2748;
                lStack_2748 = 0x20;
                auVar48 = auVar56;
              }
              else {
                auVar48 = vpshufd_avx2(auVar50,0xff);
                vpermt2q_avx512vl(auVar46,auVar48,auVar47);
                auVar55 = vpminsd_avx2(auVar51,auVar48);
                auVar51 = vpmaxsd_avx2(auVar51,auVar48);
                auVar48 = vpminsd_avx2(auVar56,auVar51);
                auVar51 = vpmaxsd_avx2(auVar56,auVar51);
                auVar56 = vpminsd_avx2(auVar49,auVar51);
                auVar49 = vpmaxsd_avx2(auVar49,auVar51);
                bVar33 = bVar33 - 1 & bVar33;
                if (bVar33 != 0) {
                  auVar52 = valignd_avx512vl(auVar50,auVar50,3);
                  auVar51 = vmovdqa64_avx512vl(auVar98._0_32_);
                  auVar53 = vmovdqa64_avx512vl(auVar98._0_32_);
                  auVar54 = vmovdqa64_avx512vl(auVar99._0_32_);
                  auVar55 = vpermt2d_avx512vl(auVar53,auVar99._0_32_,auVar55);
                  auVar53 = auVar100._0_32_;
                  auVar48 = vpermt2d_avx512vl(auVar55,auVar53,auVar48);
                  auVar55 = vmovdqa64_avx512vl(auVar53);
                  auVar56 = vpermt2d_avx512vl(auVar48,auVar53,auVar56);
                  auVar48 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar48 = vpermt2d_avx512vl(auVar56,auVar48,auVar49);
                  auVar98 = ZEXT3264(auVar48);
                  bVar31 = bVar33;
                  do {
                    auVar49 = auVar98._0_32_;
                    auVar48 = vpermps_avx512vl(auVar91._0_32_,auVar52);
                    auVar52 = valignd_avx512vl(auVar52,auVar52,1);
                    vpermt2q_avx512vl(auVar46,auVar52,auVar47);
                    bVar31 = bVar31 - 1 & bVar31;
                    uVar21 = vpcmpd_avx512vl(auVar48,auVar49,5);
                    auVar48 = vpmaxsd_avx2(auVar48,auVar49);
                    bVar22 = (byte)uVar21 << 1;
                    auVar49 = valignd_avx512vl(auVar49,auVar49,7);
                    bVar39 = (bool)((byte)uVar21 & 1);
                    bVar7 = (bool)(bVar22 >> 2 & 1);
                    bVar8 = (bool)(bVar22 >> 3 & 1);
                    bVar9 = (bool)(bVar22 >> 4 & 1);
                    bVar10 = (bool)(bVar22 >> 5 & 1);
                    bVar11 = (bool)(bVar22 >> 6 & 1);
                    auVar98 = ZEXT3264(CONCAT428((uint)(bVar22 >> 7) * auVar49._28_4_ |
                                                 (uint)!(bool)(bVar22 >> 7) * auVar48._28_4_,
                                                 CONCAT424((uint)bVar11 * auVar49._24_4_ |
                                                           (uint)!bVar11 * auVar48._24_4_,
                                                           CONCAT420((uint)bVar10 * auVar49._20_4_ |
                                                                     (uint)!bVar10 * auVar48._20_4_,
                                                                     CONCAT416((uint)bVar9 *
                                                                               auVar49._16_4_ |
                                                                               (uint)!bVar9 *
                                                                               auVar48._16_4_,
                                                                               CONCAT412((uint)bVar8
                                                                                         * auVar49.
                                                  _12_4_ | (uint)!bVar8 * auVar48._12_4_,
                                                  CONCAT48((uint)bVar7 * auVar49._8_4_ |
                                                           (uint)!bVar7 * auVar48._8_4_,
                                                           CONCAT44((uint)bVar39 * auVar49._4_4_ |
                                                                    (uint)!bVar39 * auVar48._4_4_,
                                                                    auVar48._0_4_))))))));
                  } while (bVar31 != 0);
                  lVar29 = (ulong)(uint)POPCOUNT((uint)bVar33) + 3;
                  while( true ) {
                    auVar49 = auVar98._0_32_;
                    auVar48 = vpermt2q_avx512vl(auVar46,auVar49,auVar47);
                    uVar37 = auVar48._0_8_;
                    bVar39 = lVar29 == 0;
                    lVar29 = lVar29 + -1;
                    if (bVar39) break;
                    *local_26d0 = uVar37;
                    auVar48 = vpermd_avx2(auVar49,auVar45);
                    *(int *)(local_26d0 + 1) = auVar48._0_4_;
                    auVar48 = valignd_avx512vl(auVar49,auVar49,1);
                    auVar98 = ZEXT3264(auVar48);
                    local_26d0 = local_26d0 + 2;
                  }
                  auVar45 = vmovdqa64_avx512vl(auVar51);
                  auVar98 = ZEXT3264(auVar45);
                  auVar45 = vmovdqa64_avx512vl(auVar54);
                  auVar99 = ZEXT3264(auVar45);
                  auVar45 = vmovdqa64_avx512vl(auVar55);
                  auVar100 = ZEXT3264(auVar45);
                  goto LAB_01c699b3;
                }
                auVar51 = vpermi2q_avx512vl(auVar55,auVar46,auVar47);
                uVar37 = auVar51._0_8_;
                auVar51 = vpermt2q_avx512vl(auVar46,auVar49,auVar47);
                *local_26d0 = auVar51._0_8_;
                auVar49 = vpermd_avx2(auVar49,auVar45);
                *(int *)(local_26d0 + 1) = auVar49._0_4_;
                auVar49 = vpermt2q_avx512vl(auVar46,auVar56,auVar47);
                local_26d0[2] = auVar49._0_8_;
                auVar49 = vpermd_avx2(auVar56,auVar45);
                *(int *)(local_26d0 + 3) = auVar49._0_4_;
                auVar46 = vpermt2q_avx512vl(auVar46,auVar48,auVar47);
                local_26d0[4] = auVar46._0_8_;
                lVar29 = 0x28;
                lStack_2748 = 0x30;
              }
            }
            auVar45 = vpermd_avx2(auVar48,auVar45);
            *(int *)((long)local_26d0 + lVar29) = auVar45._0_4_;
            local_26d0 = (ulong *)((long)local_26d0 + lStack_2748);
          }
        } while( true );
      }
      goto LAB_01c6998e;
    }
  }
  return;
LAB_01c69d03:
  local_26c8 = (ulong)((uint)uVar37 & 0xf) - 8;
  uVar37 = uVar37 & 0xfffffffffffffff0;
  for (local_26f0 = 0; local_26f0 != local_26c8; local_26f0 = local_26f0 + 1) {
    lVar30 = local_26f0 * 0x60;
    ppfVar2 = (context->scene->vertices).items;
    pfVar3 = ppfVar2[*(uint *)(uVar37 + 0x48 + lVar30)];
    auVar67._16_16_ = *(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar37 + 0x28 + lVar30));
    auVar67._0_16_ = *(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar37 + 8 + lVar30));
    pfVar4 = ppfVar2[*(uint *)(uVar37 + 0x40 + lVar30)];
    auVar70._16_16_ = *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar37 + 0x20 + lVar30));
    auVar70._0_16_ = *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar37 + lVar30));
    pfVar5 = ppfVar2[*(uint *)(uVar37 + 0x4c + lVar30)];
    auVar77._16_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar37 + 0x2c + lVar30));
    auVar77._0_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar37 + 0xc + lVar30));
    pfVar6 = ppfVar2[*(uint *)(uVar37 + 0x44 + lVar30)];
    auVar81._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar37 + 0x24 + lVar30));
    auVar81._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar37 + 4 + lVar30));
    lVar29 = uVar37 + 0x40 + lVar30;
    local_23c0 = *(undefined8 *)(lVar29 + 0x10);
    uStack_23b8 = *(undefined8 *)(lVar29 + 0x18);
    uStack_23b0 = local_23c0;
    uStack_23a8 = uStack_23b8;
    lVar29 = uVar37 + 0x50 + lVar30;
    local_2540 = *(undefined8 *)(lVar29 + 0x10);
    uStack_2538 = *(undefined8 *)(lVar29 + 0x18);
    auVar41 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar37 + 0x10 + lVar30)),
                            *(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar37 + 0x18 + lVar30)));
    auVar44 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar37 + 0x10 + lVar30)),
                            *(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar37 + 0x18 + lVar30)));
    auVar43 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar37 + 0x14 + lVar30)),
                            *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar37 + 0x1c + lVar30)));
    auVar12 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar37 + 0x14 + lVar30)),
                            *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar37 + 0x1c + lVar30)));
    auVar42 = vunpcklps_avx(auVar44,auVar12);
    auVar74 = vunpcklps_avx(auVar41,auVar43);
    auVar44 = vunpckhps_avx(auVar41,auVar43);
    auVar43 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar37 + 0x30 + lVar30)),
                            *(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar37 + 0x38 + lVar30)));
    auVar12 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar37 + 0x30 + lVar30)),
                            *(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar37 + 0x38 + lVar30)));
    auVar16 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar37 + 0x34 + lVar30)),
                            *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar37 + 0x3c + lVar30)));
    auVar41 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar37 + 0x34 + lVar30)),
                            *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar37 + 0x3c + lVar30)));
    auVar41 = vunpcklps_avx(auVar12,auVar41);
    auVar17 = vunpcklps_avx(auVar43,auVar16);
    auVar12 = vunpckhps_avx(auVar43,auVar16);
    uStack_2530 = local_2540;
    uStack_2528 = uStack_2538;
    auVar45 = vunpcklps_avx(auVar81,auVar77);
    auVar46 = vunpcklps_avx(auVar70,auVar67);
    auVar55 = vunpcklps_avx(auVar46,auVar45);
    auVar56 = vunpckhps_avx(auVar46,auVar45);
    auVar45 = vunpckhps_avx(auVar81,auVar77);
    auVar46 = vunpckhps_avx(auVar70,auVar67);
    auVar53 = vunpcklps_avx(auVar46,auVar45);
    auVar45._16_16_ = auVar74;
    auVar45._0_16_ = auVar74;
    auVar46._16_16_ = auVar44;
    auVar46._0_16_ = auVar44;
    auVar47._16_16_ = auVar42;
    auVar47._0_16_ = auVar42;
    auVar78._16_16_ = auVar17;
    auVar78._0_16_ = auVar17;
    auVar75._16_16_ = auVar12;
    auVar75._0_16_ = auVar12;
    auVar63._16_16_ = auVar41;
    auVar63._0_16_ = auVar41;
    auVar45 = vsubps_avx(auVar55,auVar45);
    auVar46 = vsubps_avx(auVar56,auVar46);
    auVar47 = vsubps_avx(auVar53,auVar47);
    auVar48 = vsubps_avx(auVar78,auVar55);
    auVar49 = vsubps_avx(auVar75,auVar56);
    auVar51 = vsubps_avx(auVar63,auVar53);
    auVar57._4_4_ = auVar46._4_4_ * auVar51._4_4_;
    auVar57._0_4_ = auVar46._0_4_ * auVar51._0_4_;
    auVar57._8_4_ = auVar46._8_4_ * auVar51._8_4_;
    auVar57._12_4_ = auVar46._12_4_ * auVar51._12_4_;
    auVar57._16_4_ = auVar46._16_4_ * auVar51._16_4_;
    auVar57._20_4_ = auVar46._20_4_ * auVar51._20_4_;
    auVar57._24_4_ = auVar46._24_4_ * auVar51._24_4_;
    auVar57._28_4_ = auVar41._12_4_;
    auVar12 = vfmsub231ps_fma(auVar57,auVar49,auVar47);
    auVar58._4_4_ = auVar47._4_4_ * auVar48._4_4_;
    auVar58._0_4_ = auVar47._0_4_ * auVar48._0_4_;
    auVar58._8_4_ = auVar47._8_4_ * auVar48._8_4_;
    auVar58._12_4_ = auVar47._12_4_ * auVar48._12_4_;
    auVar58._16_4_ = auVar47._16_4_ * auVar48._16_4_;
    auVar58._20_4_ = auVar47._20_4_ * auVar48._20_4_;
    auVar58._24_4_ = auVar47._24_4_ * auVar48._24_4_;
    auVar58._28_4_ = auVar42._12_4_;
    auVar41 = vfmsub231ps_fma(auVar58,auVar51,auVar45);
    auVar59._4_4_ = auVar45._4_4_ * auVar49._4_4_;
    auVar59._0_4_ = auVar45._0_4_ * auVar49._0_4_;
    auVar59._8_4_ = auVar45._8_4_ * auVar49._8_4_;
    auVar59._12_4_ = auVar45._12_4_ * auVar49._12_4_;
    auVar59._16_4_ = auVar45._16_4_ * auVar49._16_4_;
    auVar59._20_4_ = auVar45._20_4_ * auVar49._20_4_;
    auVar59._24_4_ = auVar45._24_4_ * auVar49._24_4_;
    auVar59._28_4_ = auVar74._12_4_;
    uVar68 = *(undefined4 *)&(local_2700->super_RayK<1>).dir.field_0;
    auVar87._4_4_ = uVar68;
    auVar87._0_4_ = uVar68;
    auVar87._8_4_ = uVar68;
    auVar87._12_4_ = uVar68;
    auVar87._16_4_ = uVar68;
    auVar87._20_4_ = uVar68;
    auVar87._24_4_ = uVar68;
    auVar87._28_4_ = uVar68;
    auVar52 = vbroadcastss_avx512vl(ZEXT416((uint)(local_2700->super_RayK<1>).dir.field_0.m128[1]));
    auVar57 = vbroadcastss_avx512vl(ZEXT416((uint)(local_2700->super_RayK<1>).dir.field_0.m128[2]));
    uVar68 = *(undefined4 *)&(local_2700->super_RayK<1>).org.field_0;
    auVar54._4_4_ = uVar68;
    auVar54._0_4_ = uVar68;
    auVar54._8_4_ = uVar68;
    auVar54._12_4_ = uVar68;
    auVar54._16_4_ = uVar68;
    auVar54._20_4_ = uVar68;
    auVar54._24_4_ = uVar68;
    auVar54._28_4_ = uVar68;
    auVar54 = vsubps_avx512vl(auVar55,auVar54);
    auVar43 = vfmsub231ps_fma(auVar59,auVar48,auVar46);
    uVar68 = *(undefined4 *)((long)&(local_2700->super_RayK<1>).org.field_0 + 4);
    auVar55._4_4_ = uVar68;
    auVar55._0_4_ = uVar68;
    auVar55._8_4_ = uVar68;
    auVar55._12_4_ = uVar68;
    auVar55._16_4_ = uVar68;
    auVar55._20_4_ = uVar68;
    auVar55._24_4_ = uVar68;
    auVar55._28_4_ = uVar68;
    auVar55 = vsubps_avx512vl(auVar56,auVar55);
    uVar68 = *(undefined4 *)((long)&(local_2700->super_RayK<1>).org.field_0 + 8);
    auVar56._4_4_ = uVar68;
    auVar56._0_4_ = uVar68;
    auVar56._8_4_ = uVar68;
    auVar56._12_4_ = uVar68;
    auVar56._16_4_ = uVar68;
    auVar56._20_4_ = uVar68;
    auVar56._24_4_ = uVar68;
    auVar56._28_4_ = uVar68;
    auVar56 = vsubps_avx512vl(auVar53,auVar56);
    auVar53 = vmulps_avx512vl(auVar52,auVar56);
    auVar58 = vfmsub231ps_avx512vl(auVar53,auVar55,auVar57);
    auVar53 = vmulps_avx512vl(auVar57,auVar54);
    auVar42 = vfmsub231ps_fma(auVar53,auVar56,auVar87);
    auVar53 = vmulps_avx512vl(auVar87,auVar55);
    auVar59 = vfmsub231ps_avx512vl(auVar53,auVar54,auVar52);
    auVar53 = vmulps_avx512vl(ZEXT1632(auVar43),auVar57);
    auVar53 = vfmadd231ps_avx512vl(auVar53,ZEXT1632(auVar41),auVar52);
    local_24c0 = vfmadd231ps_avx512vl(auVar53,ZEXT1632(auVar12),auVar87);
    auVar53._8_4_ = 0x7fffffff;
    auVar53._0_8_ = 0x7fffffff7fffffff;
    auVar53._12_4_ = 0x7fffffff;
    auVar53._16_4_ = 0x7fffffff;
    auVar53._20_4_ = 0x7fffffff;
    auVar53._24_4_ = 0x7fffffff;
    auVar53._28_4_ = 0x7fffffff;
    vandps_avx512vl(local_24c0,auVar53);
    auVar51 = vmulps_avx512vl(auVar51,auVar59);
    auVar44 = vfmadd231ps_fma(auVar51,ZEXT1632(auVar42),auVar49);
    auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar58,auVar48);
    auVar52._8_4_ = 0x80000000;
    auVar52._0_8_ = 0x8000000080000000;
    auVar52._12_4_ = 0x80000000;
    auVar52._16_4_ = 0x80000000;
    auVar52._20_4_ = 0x80000000;
    auVar52._24_4_ = 0x80000000;
    auVar52._28_4_ = 0x80000000;
    auVar48 = vandpd_avx512vl(local_24c0,auVar52);
    uVar40 = auVar48._0_4_;
    auVar76._0_4_ = (float)(uVar40 ^ auVar44._0_4_);
    uVar28 = auVar48._4_4_;
    auVar76._4_4_ = (float)(uVar28 ^ auVar44._4_4_);
    uVar35 = auVar48._8_4_;
    auVar76._8_4_ = (float)(uVar35 ^ auVar44._8_4_);
    uVar82 = auVar48._12_4_;
    auVar76._12_4_ = (float)(uVar82 ^ auVar44._12_4_);
    fVar62 = auVar48._16_4_;
    auVar76._16_4_ = fVar62;
    fVar83 = auVar48._20_4_;
    auVar76._20_4_ = fVar83;
    fVar84 = auVar48._24_4_;
    auVar76._24_4_ = fVar84;
    fVar85 = auVar48._28_4_;
    auVar76._28_4_ = fVar85;
    auVar47 = vmulps_avx512vl(auVar47,auVar59);
    auVar44 = vfmadd231ps_fma(auVar47,auVar46,ZEXT1632(auVar42));
    auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar45,auVar58);
    auVar79._0_4_ = (float)(uVar40 ^ auVar44._0_4_);
    auVar79._4_4_ = (float)(uVar28 ^ auVar44._4_4_);
    auVar79._8_4_ = (float)(uVar35 ^ auVar44._8_4_);
    auVar79._12_4_ = (float)(uVar82 ^ auVar44._12_4_);
    auVar79._16_4_ = fVar62;
    auVar79._20_4_ = fVar83;
    auVar79._24_4_ = fVar84;
    auVar79._28_4_ = fVar85;
    uVar21 = vcmpps_avx512vl(auVar76,ZEXT832(0) << 0x20,5);
    uVar18 = vcmpps_avx512vl(auVar79,ZEXT832(0) << 0x20,5);
    uVar19 = vcmpps_avx512vl(local_24c0,ZEXT832(0) << 0x20,4);
    auVar86._0_4_ = auVar76._0_4_ + auVar79._0_4_;
    auVar86._4_4_ = auVar76._4_4_ + auVar79._4_4_;
    auVar86._8_4_ = auVar76._8_4_ + auVar79._8_4_;
    auVar86._12_4_ = auVar76._12_4_ + auVar79._12_4_;
    auVar86._16_4_ = fVar62 + fVar62;
    auVar86._20_4_ = fVar83 + fVar83;
    auVar86._24_4_ = fVar84 + fVar84;
    auVar86._28_4_ = fVar85 + fVar85;
    uVar20 = vcmpps_avx512vl(auVar86,local_24c0,2);
    local_249f = (byte)uVar21 & (byte)uVar18 & (byte)uVar19 & (byte)uVar20;
    if (local_249f != 0) {
      auVar27._4_4_ = auVar56._4_4_ * auVar43._4_4_;
      auVar27._0_4_ = auVar56._0_4_ * auVar43._0_4_;
      auVar27._8_4_ = auVar56._8_4_ * auVar43._8_4_;
      auVar27._12_4_ = auVar56._12_4_ * auVar43._12_4_;
      auVar27._16_4_ = auVar56._16_4_ * 0.0;
      auVar27._20_4_ = auVar56._20_4_ * 0.0;
      auVar27._24_4_ = auVar56._24_4_ * 0.0;
      auVar27._28_4_ = auVar56._28_4_;
      auVar44 = vfmadd213ps_fma(auVar55,ZEXT1632(auVar41),auVar27);
      auVar44 = vfmadd213ps_fma(auVar54,ZEXT1632(auVar12),ZEXT1632(auVar44));
      local_24e0._0_4_ = (float)(uVar40 ^ auVar44._0_4_);
      local_24e0._4_4_ = (float)(uVar28 ^ auVar44._4_4_);
      local_24e0._8_4_ = (float)(uVar35 ^ auVar44._8_4_);
      local_24e0._12_4_ = (float)(uVar82 ^ auVar44._12_4_);
      local_24e0._16_4_ = fVar62;
      local_24e0._20_4_ = fVar83;
      local_24e0._24_4_ = fVar84;
      local_24e0._28_4_ = fVar85;
      uVar68 = *(undefined4 *)((long)&(local_2700->super_RayK<1>).org.field_0 + 0xc);
      auVar23._4_4_ = uVar68;
      auVar23._0_4_ = uVar68;
      auVar23._8_4_ = uVar68;
      auVar23._12_4_ = uVar68;
      auVar23._16_4_ = uVar68;
      auVar23._20_4_ = uVar68;
      auVar23._24_4_ = uVar68;
      auVar23._28_4_ = uVar68;
      auVar45 = vmulps_avx512vl(local_24c0,auVar23);
      uVar21 = vcmpps_avx512vl(auVar45,local_24e0,1);
      fVar69 = (local_2700->super_RayK<1>).tfar;
      auVar24._4_4_ = fVar69;
      auVar24._0_4_ = fVar69;
      auVar24._8_4_ = fVar69;
      auVar24._12_4_ = fVar69;
      auVar24._16_4_ = fVar69;
      auVar24._20_4_ = fVar69;
      auVar24._24_4_ = fVar69;
      auVar24._28_4_ = fVar69;
      auVar45 = vmulps_avx512vl(local_24c0,auVar24);
      uVar18 = vcmpps_avx512vl(local_24e0,auVar45,2);
      local_249f = (byte)uVar21 & (byte)uVar18 & local_249f;
      uVar40 = (uint)local_249f;
      if (local_249f != 0) {
        local_26d8 = context->scene;
        auVar45 = *(undefined1 (*) [32])&(local_2700->super_RayK<1>).tfar;
        auVar80 = ZEXT3264(auVar45);
        uVar28 = vextractps_avx(auVar45._0_16_,1);
        auVar45 = vsubps_avx(local_24c0,auVar79);
        local_2520 = vblendps_avx(auVar76,auVar45,0xf0);
        auVar45 = vsubps_avx(local_24c0,auVar76);
        local_2500 = vblendps_avx(auVar79,auVar45,0xf0);
        fVar69 = (float)DAT_01fbac00;
        local_2420._0_4_ = auVar12._0_4_ * fVar69;
        fVar71 = DAT_01fbac00._4_4_;
        local_2420._4_4_ = auVar12._4_4_ * fVar71;
        fVar72 = DAT_01fbac00._8_4_;
        local_2420._8_4_ = auVar12._8_4_ * fVar72;
        fVar73 = DAT_01fbac00._12_4_;
        local_2420._12_4_ = auVar12._12_4_ * fVar73;
        fVar13 = DAT_01fbac00._16_4_;
        local_2420._16_4_ = fVar13 * 0.0;
        fVar14 = DAT_01fbac00._20_4_;
        local_2420._20_4_ = fVar14 * 0.0;
        fVar15 = DAT_01fbac00._24_4_;
        local_2420._24_4_ = fVar15 * 0.0;
        local_2420._28_4_ = 0;
        local_2400._4_4_ = auVar41._4_4_ * fVar71;
        local_2400._0_4_ = auVar41._0_4_ * fVar69;
        local_2400._8_4_ = auVar41._8_4_ * fVar72;
        local_2400._12_4_ = auVar41._12_4_ * fVar73;
        local_2400._16_4_ = fVar13 * 0.0;
        local_2400._20_4_ = fVar14 * 0.0;
        local_2400._24_4_ = fVar15 * 0.0;
        local_2400._28_4_ = 0;
        local_23e0._4_4_ = auVar43._4_4_ * fVar71;
        local_23e0._0_4_ = auVar43._0_4_ * fVar69;
        local_23e0._8_4_ = auVar43._8_4_ * fVar72;
        local_23e0._12_4_ = auVar43._12_4_ * fVar73;
        local_23e0._16_4_ = fVar13 * 0.0;
        local_23e0._20_4_ = fVar14 * 0.0;
        local_23e0._24_4_ = fVar15 * 0.0;
        local_23e0._28_4_ = 0;
        auVar45 = vrcp14ps_avx512vl(local_24c0);
        auVar25._8_4_ = 0x3f800000;
        auVar25._0_8_ = 0x3f8000003f800000;
        auVar25._12_4_ = 0x3f800000;
        auVar25._16_4_ = 0x3f800000;
        auVar25._20_4_ = 0x3f800000;
        auVar25._24_4_ = 0x3f800000;
        auVar25._28_4_ = 0x3f800000;
        auVar46 = vfnmadd213ps_avx512vl(local_24c0,auVar45,auVar25);
        auVar44 = vfmadd132ps_fma(auVar46,auVar45,auVar45);
        fVar69 = auVar44._0_4_;
        fVar71 = auVar44._4_4_;
        local_2440._4_4_ = fVar71 * local_24e0._4_4_;
        local_2440._0_4_ = fVar69 * local_24e0._0_4_;
        fVar72 = auVar44._8_4_;
        local_2440._8_4_ = fVar72 * local_24e0._8_4_;
        fVar73 = auVar44._12_4_;
        local_2440._12_4_ = fVar73 * local_24e0._12_4_;
        local_2440._16_4_ = fVar62 * 0.0;
        local_2440._20_4_ = fVar83 * 0.0;
        local_2440._24_4_ = fVar84 * 0.0;
        local_2440._28_4_ = fVar85;
        auVar66 = ZEXT3264(local_2440);
        local_2480[0] = local_2520._0_4_ * fVar69;
        local_2480[1] = local_2520._4_4_ * fVar71;
        local_2480[2] = local_2520._8_4_ * fVar72;
        local_2480[3] = local_2520._12_4_ * fVar73;
        fStack_2470 = local_2520._16_4_ * 0.0;
        fStack_246c = local_2520._20_4_ * 0.0;
        fStack_2468 = local_2520._24_4_ * 0.0;
        uStack_2464 = auVar45._28_4_;
        local_2460[0] = local_2500._0_4_ * fVar69;
        local_2460[1] = local_2500._4_4_ * fVar71;
        local_2460[2] = local_2500._8_4_ * fVar72;
        local_2460[3] = local_2500._12_4_ * fVar73;
        fStack_2450 = local_2500._16_4_ * 0.0;
        fStack_244c = local_2500._20_4_ * 0.0;
        fStack_2448 = local_2500._24_4_ * 0.0;
        uStack_2444 = auVar45._28_4_;
        auVar64._8_4_ = 0x7f800000;
        auVar64._0_8_ = 0x7f8000007f800000;
        auVar64._12_4_ = 0x7f800000;
        auVar64._16_4_ = 0x7f800000;
        auVar64._20_4_ = 0x7f800000;
        auVar64._24_4_ = 0x7f800000;
        auVar64._28_4_ = 0x7f800000;
        auVar45 = vblendmps_avx512vl(auVar64,local_2440);
        auVar60._0_4_ =
             (uint)(local_249f & 1) * auVar45._0_4_ | (uint)!(bool)(local_249f & 1) * 0x7f800000;
        bVar39 = (bool)(local_249f >> 1 & 1);
        auVar60._4_4_ = (uint)bVar39 * auVar45._4_4_ | (uint)!bVar39 * 0x7f800000;
        bVar39 = (bool)(local_249f >> 2 & 1);
        auVar60._8_4_ = (uint)bVar39 * auVar45._8_4_ | (uint)!bVar39 * 0x7f800000;
        bVar39 = (bool)(local_249f >> 3 & 1);
        auVar60._12_4_ = (uint)bVar39 * auVar45._12_4_ | (uint)!bVar39 * 0x7f800000;
        bVar39 = (bool)(local_249f >> 4 & 1);
        auVar60._16_4_ = (uint)bVar39 * auVar45._16_4_ | (uint)!bVar39 * 0x7f800000;
        bVar39 = (bool)(local_249f >> 5 & 1);
        auVar60._20_4_ = (uint)bVar39 * auVar45._20_4_ | (uint)!bVar39 * 0x7f800000;
        bVar39 = (bool)(local_249f >> 6 & 1);
        auVar60._24_4_ = (uint)bVar39 * auVar45._24_4_ | (uint)!bVar39 * 0x7f800000;
        auVar60._28_4_ =
             (uint)(local_249f >> 7) * auVar45._28_4_ | (uint)!(bool)(local_249f >> 7) * 0x7f800000;
        auVar45 = vshufps_avx(auVar60,auVar60,0xb1);
        auVar45 = vminps_avx(auVar60,auVar45);
        auVar46 = vshufpd_avx(auVar45,auVar45,5);
        auVar45 = vminps_avx(auVar45,auVar46);
        auVar46 = vpermpd_avx2(auVar45,0x4e);
        auVar45 = vminps_avx(auVar45,auVar46);
        uVar21 = vcmpps_avx512vl(auVar60,auVar45,0);
        bVar33 = local_249f & (byte)uVar21;
        do {
          uVar35 = uVar40;
          if (bVar33 != 0) {
            uVar35 = (uint)bVar33;
          }
          uVar82 = 0;
          for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x80000000) {
            uVar82 = uVar82 + 1;
          }
          uVar35 = uVar82 & 0xff;
          local_2678 = *(uint *)((long)&local_23c0 + (ulong)uVar35 * 4);
          local_26e0 = (local_26d8->geometries).items[local_2678].ptr;
          if ((local_26e0->mask & uVar28) == 0) {
            uVar40 = (uint)(byte)(~(byte)(1 << (uVar82 & 0x1f)) & (byte)uVar40);
          }
          else {
            local_26f8 = local_26e8->args;
            local_2660 = auVar80._0_32_;
            local_2640 = auVar66._0_32_;
            local_2620 = auVar95._0_32_;
            local_2600 = auVar94._0_32_;
            local_25e0 = auVar93._0_32_;
            local_25c0 = auVar92._0_32_;
            local_25a0 = auVar90._0_32_;
            local_2580 = auVar89._0_32_;
            local_2560 = auVar88._0_32_;
            if (local_26e8->args->filter == (RTCFilterFunctionN)0x0) {
              local_26c0.context = local_26e8->user;
              if (local_26e0->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                uVar32 = (ulong)(uVar35 << 2);
                fVar62 = *(float *)((long)local_2480 + uVar32);
                fVar83 = *(float *)((long)local_2460 + uVar32);
                (local_2700->super_RayK<1>).tfar = *(float *)(local_2440 + uVar32);
                (local_2700->Ng).field_0.field_0.x = *(float *)(local_2420 + uVar32);
                (local_2700->Ng).field_0.field_0.y = *(float *)(local_2400 + uVar32);
                (local_2700->Ng).field_0.field_0.z = *(float *)(local_23e0 + uVar32);
                local_2700->u = fVar62;
                local_2700->v = fVar83;
                local_2700->primID = *(uint *)((long)&local_2540 + uVar32);
                local_2700->geomID = local_2678;
                local_2700->instID[0] = (local_26c0.context)->instID[0];
                local_2700->instPrimID[0] = (local_26c0.context)->instPrimID[0];
                break;
              }
            }
            else {
              local_26c0.context = local_26e8->user;
            }
            uVar32 = (ulong)(uVar35 * 4);
            local_2690 = *(float *)(local_2420 + uVar32);
            local_268c = *(undefined4 *)(local_2400 + uVar32);
            local_2688 = *(undefined4 *)(local_23e0 + uVar32);
            local_2684 = *(undefined4 *)((long)local_2480 + uVar32);
            local_2680 = *(undefined4 *)((long)local_2460 + uVar32);
            local_267c = *(undefined4 *)((long)&local_2540 + uVar32);
            local_2674 = (local_26c0.context)->instID[0];
            local_2670 = (local_26c0.context)->instPrimID[0];
            (local_2700->super_RayK<1>).tfar = *(float *)(local_2440 + uVar32);
            local_2714 = -1;
            local_26c0.valid = &local_2714;
            local_26c0.geometryUserPtr = local_26e0->userPtr;
            local_26c0.ray = (RTCRayN *)local_2700;
            local_26c0.hit = (RTCHitN *)&local_2690;
            local_26c0.N = 1;
            if (((local_26e0->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                ((*local_26e0->intersectionFilterN)(&local_26c0), *local_26c0.valid != 0)) &&
               ((local_26f8->filter == (RTCFilterFunctionN)0x0 ||
                ((((local_26f8->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                   RTC_RAY_QUERY_FLAG_INCOHERENT && (((local_26e0->field_8).field_0x2 & 0x40) == 0))
                 || ((*local_26f8->filter)(&local_26c0), *local_26c0.valid != 0)))))) {
              (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.x =
                   *(float *)local_26c0.hit;
              (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.y =
                   *(float *)(local_26c0.hit + 4);
              (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.z =
                   *(float *)(local_26c0.hit + 8);
              *(float *)((long)local_26c0.ray + 0x3c) = *(float *)(local_26c0.hit + 0xc);
              *(float *)((long)local_26c0.ray + 0x40) = *(float *)(local_26c0.hit + 0x10);
              *(float *)((long)local_26c0.ray + 0x44) = *(float *)(local_26c0.hit + 0x14);
              *(float *)((long)local_26c0.ray + 0x48) = *(float *)(local_26c0.hit + 0x18);
              *(float *)((long)local_26c0.ray + 0x4c) = *(float *)(local_26c0.hit + 0x1c);
              *(float *)((long)local_26c0.ray + 0x50) = *(float *)(local_26c0.hit + 0x20);
            }
            else {
              (local_2700->super_RayK<1>).tfar = (float)local_2660._0_4_;
            }
            auVar66 = ZEXT3264(local_2640);
            fVar62 = (local_2700->super_RayK<1>).tfar;
            auVar26._4_4_ = fVar62;
            auVar26._0_4_ = fVar62;
            auVar26._8_4_ = fVar62;
            auVar26._12_4_ = fVar62;
            auVar26._16_4_ = fVar62;
            auVar26._20_4_ = fVar62;
            auVar26._24_4_ = fVar62;
            auVar26._28_4_ = fVar62;
            uVar21 = vcmpps_avx512vl(local_2640,auVar26,2);
            uVar40 = (uint)(byte)(~(byte)(1 << (uVar82 & 0x1f)) & (byte)uVar40) & (uint)uVar21;
            uVar28 = (local_2700->super_RayK<1>).mask;
            auVar80 = ZEXT464((uint)(local_2700->super_RayK<1>).tfar);
            auVar88 = ZEXT3264(local_2560);
            auVar89 = ZEXT3264(local_2580);
            auVar90 = ZEXT3264(local_25a0);
            auVar45 = vbroadcastss_avx512vl(ZEXT416(1));
            auVar91 = ZEXT3264(auVar45);
            auVar92 = ZEXT3264(local_25c0);
            auVar93 = ZEXT3264(local_25e0);
            auVar94 = ZEXT3264(local_2600);
            auVar95 = ZEXT3264(local_2620);
            auVar45 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
            auVar96 = ZEXT3264(auVar45);
            auVar45 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
            auVar97 = ZEXT3264(auVar45);
            auVar44 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
            auVar98 = ZEXT1664(auVar44);
            auVar45 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
            auVar99 = ZEXT3264(auVar45);
            auVar45 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
            auVar100 = ZEXT3264(auVar45);
          }
          bVar33 = (byte)uVar40;
          if (bVar33 == 0) break;
          auVar65._8_4_ = 0x7f800000;
          auVar65._0_8_ = 0x7f8000007f800000;
          auVar65._12_4_ = 0x7f800000;
          auVar65._16_4_ = 0x7f800000;
          auVar65._20_4_ = 0x7f800000;
          auVar65._24_4_ = 0x7f800000;
          auVar65._28_4_ = 0x7f800000;
          auVar45 = vblendmps_avx512vl(auVar65,auVar66._0_32_);
          auVar61._0_4_ =
               (uint)(bVar33 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar33 & 1) * 0x7f800000;
          bVar39 = (bool)((byte)(uVar40 >> 1) & 1);
          auVar61._4_4_ = (uint)bVar39 * auVar45._4_4_ | (uint)!bVar39 * 0x7f800000;
          bVar39 = (bool)((byte)(uVar40 >> 2) & 1);
          auVar61._8_4_ = (uint)bVar39 * auVar45._8_4_ | (uint)!bVar39 * 0x7f800000;
          bVar39 = (bool)((byte)(uVar40 >> 3) & 1);
          auVar61._12_4_ = (uint)bVar39 * auVar45._12_4_ | (uint)!bVar39 * 0x7f800000;
          bVar39 = (bool)((byte)(uVar40 >> 4) & 1);
          auVar61._16_4_ = (uint)bVar39 * auVar45._16_4_ | (uint)!bVar39 * 0x7f800000;
          bVar39 = (bool)((byte)(uVar40 >> 5) & 1);
          auVar61._20_4_ = (uint)bVar39 * auVar45._20_4_ | (uint)!bVar39 * 0x7f800000;
          bVar39 = (bool)((byte)(uVar40 >> 6) & 1);
          auVar61._24_4_ = (uint)bVar39 * auVar45._24_4_ | (uint)!bVar39 * 0x7f800000;
          auVar61._28_4_ = (uVar40 >> 7) * auVar45._28_4_ | (uint)!SUB41(uVar40 >> 7,0) * 0x7f800000
          ;
          auVar45 = vshufps_avx(auVar61,auVar61,0xb1);
          auVar45 = vminps_avx(auVar61,auVar45);
          auVar46 = vshufpd_avx(auVar45,auVar45,5);
          auVar45 = vminps_avx(auVar45,auVar46);
          auVar46 = vpermpd_avx2(auVar45,0x4e);
          auVar45 = vminps_avx(auVar45,auVar46);
          uVar21 = vcmpps_avx512vl(auVar61,auVar45,0);
          bVar33 = (byte)uVar21 & bVar33;
        } while( true );
      }
    }
    context = local_26e8;
  }
  fVar62 = (local_2700->super_RayK<1>).tfar;
  auVar66 = ZEXT3264(CONCAT428(fVar62,CONCAT424(fVar62,CONCAT420(fVar62,CONCAT416(fVar62,CONCAT412(
                                                  fVar62,CONCAT48(fVar62,CONCAT44(fVar62,fVar62)))))
                                               )));
  goto LAB_01c6998e;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }